

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int Configcmp(char *_a,char *_b)

{
  int iVar1;
  
  iVar1 = *(int *)(*(long *)_a + 0x60) - *(int *)(*(long *)_b + 0x60);
  if (iVar1 != 0) {
    return iVar1;
  }
  return *(int *)(_a + 8) - *(int *)(_b + 8);
}

Assistant:

int Configcmp(const char *_a,const char *_b)
{
  const struct config *a = (struct config *) _a;
  const struct config *b = (struct config *) _b;
  int x;
  x = a->rp->index - b->rp->index;
  if( x==0 ) x = a->dot - b->dot;
  return x;
}